

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSSerializerImpl.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::DOMLSSerializerImpl::ensureValidString
          (DOMLSSerializerImpl *this,DOMNode *nodeToWrite,XMLCh *string)

{
  XMLCh *pXVar1;
  byte bVar2;
  XMLCh XVar3;
  
  if (string != (XMLCh *)0x0) {
    XVar3 = *string;
    while (XVar3 != L'\0') {
      if (this->fIsXml11 == true) {
        bVar2 = (&XMLChar1_1::fgCharCharsTable1_1)[(ushort)XVar3];
      }
      else {
        bVar2 = (&XMLChar1_0::fgCharCharsTable1_0)[(ushort)XVar3];
      }
      if ((bVar2 & 0x40) == 0) {
        if ((XVar3 & 0xfc00U) == 0xd800) {
          if ((string[1] & 0xfc00U) != 0xdc00) {
            reportError(this,nodeToWrite,DOM_SEVERITY_FATAL_ERROR,INVALID_CHARACTER_ERR);
            return;
          }
          string = string + 1;
        }
        else {
          reportError(this,nodeToWrite,DOM_SEVERITY_FATAL_ERROR,INVALID_CHARACTER_ERR);
        }
      }
      pXVar1 = string + 1;
      string = string + 1;
      XVar3 = *pXVar1;
    }
  }
  return;
}

Assistant:

void DOMLSSerializerImpl::ensureValidString(const DOMNode* nodeToWrite, const XMLCh* string)
{
    // XERCESC-1854: prevent illegal characters from being written
    // XERCESC-2130: allow surrogates
    if(string==0)
        return;
    const XMLCh* cursor=string;
    while(*cursor!=0)
    {
        if((fIsXml11 && !XMLChar1_1::isXMLChar(*cursor)) || (!fIsXml11 && !XMLChar1_0::isXMLChar(*cursor)))
        {
            if((*cursor >= 0xD800) && (*cursor <= 0xDBFF))
            {
                XMLCh leadingSurrogate = *cursor;
                cursor++;
                if(0==*cursor || (fIsXml11 && !XMLChar1_1::isXMLChar(leadingSurrogate, *cursor)) || (!fIsXml11 && !XMLChar1_0::isXMLChar(leadingSurrogate, *cursor)))
                {
                    reportError(nodeToWrite, DOMError::DOM_SEVERITY_FATAL_ERROR, XMLDOMMsg::INVALID_CHARACTER_ERR);
                    return; // leave if reportError does not throw
                }
            }
            else
            {
                reportError(nodeToWrite, DOMError::DOM_SEVERITY_FATAL_ERROR, XMLDOMMsg::INVALID_CHARACTER_ERR);
            }
        }
        cursor++;
    }
}